

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O3

int ExportAlpha(WebPDecParams *p,int y_pos,int max_lines_out)

{
  WEBP_CSP_MODE WVar1;
  int iVar2;
  WebPDecBuffer *pWVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  WebPRescaler *wrk;
  int iVar7;
  uint8_t *puVar8;
  int iVar9;
  uint8_t *puVar10;
  bool bVar11;
  
  pWVar3 = p->output;
  wrk = p->scaler_a;
  WVar1 = pWVar3->colorspace;
  iVar9 = 0;
  if (wrk->dst_y < wrk->dst_height) {
    iVar7 = (pWVar3->u).RGBA.stride;
    iVar2 = wrk->dst_width;
    puVar8 = (pWVar3->u).RGBA.rgba + (long)y_pos * (long)iVar7;
    if (max_lines_out < 1 || 0 < wrk->y_accum) {
      iVar9 = 0;
      bVar11 = false;
    }
    else {
      puVar10 = puVar8 + (ulong)(WVar1 != MODE_ARGB && WVar1 != MODE_Argb) * 3;
      uVar6 = 0;
      iVar4 = 1;
      do {
        iVar9 = iVar4;
        WebPRescalerExportRow(wrk);
        uVar5 = (*WebPDispatchAlpha)(p->scaler_a->dst,0,iVar2,1,puVar10,0);
        uVar6 = uVar5 | uVar6;
        iVar7 = (pWVar3->u).RGBA.stride;
        wrk = p->scaler_a;
        if ((wrk->dst_height <= wrk->dst_y) || (0 < wrk->y_accum)) break;
        puVar10 = puVar10 + iVar7;
        iVar4 = iVar9 + 1;
      } while (iVar9 < max_lines_out);
      bVar11 = uVar6 != 0;
    }
    if ((WVar1 - MODE_rgbA < 4) && (bVar11)) {
      (*WebPApplyAlphaMultiply)
                (puVar8,(uint)(WVar1 == MODE_ARGB || WVar1 == MODE_Argb),iVar2,iVar9,iVar7);
    }
  }
  return iVar9;
}

Assistant:

static int ExportAlpha(WebPDecParams* const p, int y_pos, int max_lines_out) {
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* const base_rgba = buf->rgba + (ptrdiff_t)y_pos * buf->stride;
  const WEBP_CSP_MODE colorspace = p->output->colorspace;
  const int alpha_first =
      (colorspace == MODE_ARGB || colorspace == MODE_Argb);
  uint8_t* dst = base_rgba + (alpha_first ? 0 : 3);
  int num_lines_out = 0;
  const int is_premult_alpha = WebPIsPremultipliedMode(colorspace);
  uint32_t non_opaque = 0;
  const int width = p->scaler_a->dst_width;

  while (WebPRescalerHasPendingOutput(p->scaler_a) &&
         num_lines_out < max_lines_out) {
    assert(y_pos + num_lines_out < p->output->height);
    WebPRescalerExportRow(p->scaler_a);
    non_opaque |= WebPDispatchAlpha(p->scaler_a->dst, 0, width, 1, dst, 0);
    dst += buf->stride;
    ++num_lines_out;
  }
  if (is_premult_alpha && non_opaque) {
    WebPApplyAlphaMultiply(base_rgba, alpha_first,
                           width, num_lines_out, buf->stride);
  }
  return num_lines_out;
}